

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_bitshift(ASMState *as,IRIns *ir,x86Shift xs,x86Op xv)

{
  byte bVar1;
  ushort uVar2;
  IRIns *pIVar3;
  MCode *pMVar4;
  Reg RVar5;
  Reg RVar6;
  Reg rb;
  int in_ECX;
  int in_EDX;
  int iVar7;
  long in_RSI;
  ASMState *in_RDI;
  Reg right_1;
  Reg right;
  Reg left_1;
  Reg left;
  int shift;
  Reg dest;
  IRIns *irr;
  IRRef rref;
  RegSet in_stack_ffffffffffffffb8;
  RegSet in_stack_ffffffffffffffbc;
  RegSet in_stack_ffffffffffffffc0;
  IRRef in_stack_ffffffffffffffc4;
  IRRef in_stack_ffffffffffffffc8;
  Reg in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  
  uVar2 = *(ushort *)(in_RSI + 2);
  pIVar3 = in_RDI->ir;
  if (uVar2 < 0x8000) {
    RVar5 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (IRIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    in_stack_ffffffffffffffd0 = 0x1f;
    if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
      in_stack_ffffffffffffffd0 = 0x3f;
    }
    in_stack_ffffffffffffffd0 = pIVar3[(uint)uVar2].field_1.op12 & in_stack_ffffffffffffffd0;
    if ((((in_ECX == 0) && (in_stack_ffffffffffffffd0 != 0)) && ((in_RDI->flags & 0x40) != 0)) &&
       (in_stack_ffffffffffffffcc =
             asm_fuseloadm((ASMState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                           ,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffbc), in_stack_ffffffffffffffcc != RVar5)) {
      if (in_EDX == 0) {
        in_stack_ffffffffffffffd0 = -in_stack_ffffffffffffffd0;
      }
      pMVar4 = in_RDI->mcp;
      in_RDI->mcp = pMVar4 + -1;
      pMVar4[-1] = (MCode)in_stack_ffffffffffffffd0;
      iVar7 = 0;
      if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
        iVar7 = 0x800000;
      }
      emit_mrm(in_RDI,iVar7 + XV_RORX,RVar5,in_stack_ffffffffffffffcc);
      return;
    }
    if (in_stack_ffffffffffffffd0 != 0) {
      if (in_stack_ffffffffffffffd0 == 1) {
        iVar7 = 0;
        if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
          iVar7 = 0x80200;
        }
        emit_rr(in_RDI,XO_SHIFT1,in_EDX + iVar7,RVar5);
      }
      else {
        pMVar4 = in_RDI->mcp;
        in_RDI->mcp = pMVar4 + -1;
        pMVar4[-1] = (MCode)in_stack_ffffffffffffffd0;
        iVar7 = 0;
        if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
          iVar7 = 0x80200;
        }
        emit_rr(in_RDI,XO_SHIFTi,in_EDX + iVar7,RVar5);
      }
    }
  }
  else {
    if (((in_RDI->flags & 0x40) != 0) && (in_ECX != 0)) {
      RVar5 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (IRIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
      RVar6 = ra_alloc1((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
      rb = asm_fuseloadm((ASMState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                         RVar6,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      iVar7 = 0;
      if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
        iVar7 = 0x800000;
      }
      emit_mrm(in_RDI,in_ECX + iVar7 ^ RVar6 << 0x13,RVar5,rb);
      return;
    }
    RVar5 = ra_dest((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    (IRIns *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),0);
    if (RVar5 == 1) {
      RVar5 = ra_scratch((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         in_stack_ffffffffffffffbc);
      iVar7 = 0;
      if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
        iVar7 = 0x80200;
      }
      emit_rr(in_RDI,XO_MOV,iVar7 + 1,RVar5);
    }
    bVar1 = pIVar3[(uint)uVar2].field_1.r;
    RVar6 = (Reg)bVar1;
    if ((bVar1 & 0x80) == 0) {
      if (RVar6 != 1) {
        ra_scratch((ASMState *)CONCAT44(in_stack_ffffffffffffffc4,RVar6),in_stack_ffffffffffffffbc);
      }
    }
    else {
      RVar6 = ra_allocref((ASMState *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,RVar6);
    }
    iVar7 = 0;
    if ((0x604208U >> (*(byte *)(in_RSI + 4) & 0x1f) & 1) != 0) {
      iVar7 = 0x80200;
    }
    emit_rr(in_RDI,XO_SHIFTcl,in_EDX + iVar7,RVar5);
    in_RDI->weakset = (1 << ((byte)RVar6 & 0x1f) ^ 0xffffffffU) & in_RDI->weakset;
    if (RVar6 != 1) {
      emit_rr(in_RDI,XO_MOV,1,RVar6);
    }
  }
  ra_left((ASMState *)CONCAT44(RVar5,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
          in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void asm_bitshift(ASMState *as, IRIns *ir, x86Shift xs, x86Op xv)
{
  IRRef rref = ir->op2;
  IRIns *irr = IR(rref);
  Reg dest;
  if (irref_isk(rref)) {  /* Constant shifts. */
    int shift;
    dest = ra_dest(as, ir, RSET_GPR);
    shift = irr->i & (irt_is64(ir->t) ? 63 : 31);
    if (!xv && shift && (as->flags & JIT_F_BMI2)) {
      Reg left = asm_fuseloadm(as, ir->op1, RSET_GPR, irt_is64(ir->t));
      if (left != dest) {  /* BMI2 rotate right by constant. */
	emit_i8(as, xs == XOg_ROL ? -shift : shift);
	emit_mrm(as, VEX_64IR(ir, XV_RORX), dest, left);
	return;
      }
    }
    switch (shift) {
    case 0: break;
    case 1: emit_rr(as, XO_SHIFT1, REX_64IR(ir, xs), dest); break;
    default: emit_shifti(as, REX_64IR(ir, xs), dest, shift); break;
    }
  } else if ((as->flags & JIT_F_BMI2) && xv) {	/* BMI2 variable shifts. */
    Reg left, right;
    dest = ra_dest(as, ir, RSET_GPR);
    right = ra_alloc1(as, rref, RSET_GPR);
    left = asm_fuseloadm(as, ir->op1, rset_exclude(RSET_GPR, right),
			 irt_is64(ir->t));
    emit_mrm(as, VEX_64IR(ir, xv) ^ (right << 19), dest, left);
    return;
  } else {  /* Variable shifts implicitly use register cl (i.e. ecx). */
    Reg right;
    dest = ra_dest(as, ir, rset_exclude(RSET_GPR, RID_ECX));
    if (dest == RID_ECX) {
      dest = ra_scratch(as, rset_exclude(RSET_GPR, RID_ECX));
      emit_rr(as, XO_MOV, REX_64IR(ir, RID_ECX), dest);
    }
    right = irr->r;
    if (ra_noreg(right))
      right = ra_allocref(as, rref, RID2RSET(RID_ECX));
    else if (right != RID_ECX)
      ra_scratch(as, RID2RSET(RID_ECX));
    emit_rr(as, XO_SHIFTcl, REX_64IR(ir, xs), dest);
    ra_noweak(as, right);
    if (right != RID_ECX)
      emit_rr(as, XO_MOV, RID_ECX, right);
  }
  ra_left(as, dest, ir->op1);
  /*
  ** Note: avoid using the flags resulting from a shift or rotate!
  ** All of them cause a partial flag stall, except for r,1 shifts
  ** (but not rotates). And a shift count of 0 leaves the flags unmodified.
  */
}